

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

void __thiscall mkvmuxer::VideoTrack::VideoTrack(VideoTrack *this,uint *seed)

{
  uint64 uVar1;
  
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__AudioTrack_005d01b8;
  (this->super_Track).codec_id_ = (char *)0x0;
  (this->super_Track).codec_private_ = (uint8_t *)0x0;
  (this->super_Track).language_ = (char *)0x0;
  (this->super_Track).max_block_additional_id_ = 0;
  (this->super_Track).name_ = (char *)0x0;
  (this->super_Track).number_ = 0;
  (this->super_Track).type_ = 0;
  uVar1 = MakeUID(seed);
  (this->super_Track).uid_ = uVar1;
  (this->super_Track).codec_delay_ = 0;
  (this->super_Track).seek_pre_roll_ = 0;
  (this->super_Track).default_duration_ = 0;
  (this->super_Track).codec_private_length_ = 0;
  *(undefined8 *)((long)&(this->super_Track).codec_private_length_ + 4) = 0;
  *(undefined8 *)((long)&(this->super_Track).content_encoding_entries_ + 4) = 0;
  (this->super_Track)._vptr_Track = (_func_int **)&PTR__VideoTrack_005d01f8;
  this->display_height_ = 0;
  this->display_width_ = 0;
  this->pixel_height_ = 0;
  this->pixel_width_ = 0;
  this->crop_left_ = 0;
  this->crop_right_ = 0;
  this->crop_top_ = 0;
  this->crop_bottom_ = 0;
  this->frame_rate_ = 0.0;
  this->height_ = 0;
  this->stereo_mode_ = 0;
  this->alpha_mode_ = 0;
  this->width_ = 0;
  this->colour_space_ = (char *)0x0;
  this->colour_ = (Colour *)0x0;
  this->projection_ = (Projection *)0x0;
  return;
}

Assistant:

VideoTrack::VideoTrack(unsigned int* seed)
    : Track(seed),
      display_height_(0),
      display_width_(0),
      pixel_height_(0),
      pixel_width_(0),
      crop_left_(0),
      crop_right_(0),
      crop_top_(0),
      crop_bottom_(0),
      frame_rate_(0.0),
      height_(0),
      stereo_mode_(0),
      alpha_mode_(0),
      width_(0),
      colour_space_(NULL),
      colour_(NULL),
      projection_(NULL) {}